

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderPrimitiveCoverage.cpp
# Opt level: O2

IterateResult __thiscall
glcts::TessellationShaderPrimitiveCoverage::iterate(TessellationShaderPrimitiveCoverage *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  deUint32 err;
  undefined4 extraout_var;
  char *description;
  byte bVar4;
  pointer p_Var5;
  GLint gl_max_tess_gen_level_value;
  _tessellation_levels_set levels_sets;
  GLfloat inner_tess_levels_single [2];
  GLfloat outer_tess_levels_single [4];
  _Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_> local_48;
  
  iVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  initTest(this);
  inner_tess_levels_single[0] = 1.0;
  inner_tess_levels_single[1] = 1.0;
  outer_tess_levels_single[0] = 1.0;
  outer_tess_levels_single[1] = 1.0;
  outer_tess_levels_single[2] = 1.0;
  outer_tess_levels_single[3] = 1.0;
  gl_max_tess_gen_level_value = 0;
  (**(code **)(CONCAT44(extraout_var,iVar3) + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_TESS_GEN_LEVEL,
             &gl_max_tess_gen_level_value);
  err = (**(code **)(CONCAT44(extraout_var,iVar3) + 0x800))();
  glu::checkError(err,"glGetIntegerv() call failed for GL_MAX_TESS_GEN_LEVEL_EXT pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPrimitiveCoverage.cpp"
                  ,0x2ef);
  drawPatch(this,this->m_triangles_tessellation_po_id,3,3,inner_tess_levels_single,
            outer_tess_levels_single);
  bVar1 = verifyDrawBufferContents(this);
  TessellationShaderUtils::getTessellationLevelSetForPrimitiveMode
            (&levels_sets,TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES,gl_max_tess_gen_level_value,
             TESSELLATION_LEVEL_SET_FILTER_ALL_LEVELS_USE_THE_SAME_VALUE);
  for (p_Var5 = levels_sets.
                super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                ._M_impl.super__Vector_impl_data._M_start;
      p_Var5 != levels_sets.
                super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                ._M_impl.super__Vector_impl_data._M_finish; p_Var5 = p_Var5 + 1) {
    drawPatch(this,this->m_triangles_tessellation_po_id,3,3,p_Var5->inner,p_Var5->outer);
    bVar2 = verifyDrawBufferContents(this);
    bVar1 = (bool)(bVar1 & bVar2);
  }
  drawPatch(this,this->m_quad_tessellation_po_id,4,6,inner_tess_levels_single,
            outer_tess_levels_single);
  bVar2 = verifyDrawBufferContents(this);
  TessellationShaderUtils::getTessellationLevelSetForPrimitiveMode
            ((_tessellation_levels_set *)&local_48,TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS,
             gl_max_tess_gen_level_value,TESSELLATION_LEVEL_SET_FILTER_ALL_LEVELS_USE_THE_SAME_VALUE
            );
  bVar4 = bVar1 & bVar2;
  std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>::
  _M_move_assign(&levels_sets,&local_48);
  std::_Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>::
  ~_Vector_base(&local_48);
  for (p_Var5 = levels_sets.
                super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                ._M_impl.super__Vector_impl_data._M_start;
      p_Var5 != levels_sets.
                super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                ._M_impl.super__Vector_impl_data._M_finish; p_Var5 = p_Var5 + 1) {
    drawPatch(this,this->m_quad_tessellation_po_id,4,6,p_Var5->inner,p_Var5->outer);
    bVar1 = verifyDrawBufferContents(this);
    bVar4 = bVar4 & bVar1;
  }
  description = "Fail";
  if (bVar4 != 0) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
             (byte)~bVar4 & QP_TEST_RESULT_FAIL,description);
  std::_Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>::
  ~_Vector_base(&levels_sets.
                 super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
               );
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult TessellationShaderPrimitiveCoverage::iterate(void)
{
	/* Retriveing GL. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Initialize test */
	initTest();

	bool has_test_passed = true;

	/* Define tessellation level values that we will use to draw single tessellated primitive */
	const glw::GLfloat inner_tess_levels_single[] = { 1.0f, 1.0f };
	const glw::GLfloat outer_tess_levels_single[] = { 1.0f, 1.0f, 1.0f, 1.0f };

	/* Retrieve GL_MAX_TESS_GEN_LEVEL_EXT value */
	glw::GLint gl_max_tess_gen_level_value = 0;

	gl.getIntegerv(m_glExtTokens.MAX_TESS_GEN_LEVEL, &gl_max_tess_gen_level_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() call failed for GL_MAX_TESS_GEN_LEVEL_EXT pname");

	/* Verify no cracks can be found if a degenerate triangle
	 * is outputted by the tessellator */
	drawPatch(m_triangles_tessellation_po_id, 3 /* n_patch_vertices */, 3 /* n_triangle_vertices */,
			  inner_tess_levels_single, outer_tess_levels_single);

	has_test_passed &= verifyDrawBufferContents();

	/* Verify no cracks can be found if multiple triangles
	 * are outputted by the tessellator.
	 */
	_tessellation_levels_set levels_sets = TessellationShaderUtils::getTessellationLevelSetForPrimitiveMode(
		TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES, gl_max_tess_gen_level_value,
		TESSELLATION_LEVEL_SET_FILTER_ALL_LEVELS_USE_THE_SAME_VALUE);

	for (_tessellation_levels_set_const_iterator set_iterator = levels_sets.begin(); set_iterator != levels_sets.end();
		 set_iterator++)
	{
		const _tessellation_levels& set = *set_iterator;

		drawPatch(m_triangles_tessellation_po_id, 3 /* n_patch_vertices */, 3 /* n_triangle_vertices */, set.inner,
				  set.outer);

		has_test_passed &= verifyDrawBufferContents();
	}

	/* Verify no cracks can be found if a degenerate quad
	 * is outputted by the tessellator.
	 */
	drawPatch(m_quad_tessellation_po_id, 4 /* n_patch_vertices */, 6 /* n_triangle_vertices (quad == 2 triangles) */,
			  inner_tess_levels_single, outer_tess_levels_single);

	has_test_passed &= verifyDrawBufferContents();

	/* Verify no cracks can be found if multiple triangles
	 * (to which the generated quads will be broken into)
	 * are outputted by the tessellator.
	 */
	levels_sets = TessellationShaderUtils::getTessellationLevelSetForPrimitiveMode(
		TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS, gl_max_tess_gen_level_value,
		TESSELLATION_LEVEL_SET_FILTER_ALL_LEVELS_USE_THE_SAME_VALUE);

	for (_tessellation_levels_set_const_iterator set_iterator = levels_sets.begin(); set_iterator != levels_sets.end();
		 set_iterator++)
	{
		const _tessellation_levels& set = *set_iterator;

		drawPatch(m_quad_tessellation_po_id, 4 /* n_patch_vertices */,
				  6 /* n_triangle_vertices (quad == 2 triangles) */, set.inner, set.outer);
		has_test_passed &= verifyDrawBufferContents();
	}

	/* Has the test passed? */
	if (has_test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}